

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_convert.cpp
# Opt level: O2

void __thiscall tst_qpromise_convert::rejectUnconvertibleTypes(tst_qpromise_convert *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QString>_> QVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar3;
  bool bVar4;
  char cVar5;
  PromiseData<QString> *pPVar6;
  QPromiseReject<QString> *reject;
  initializer_list<int> __l;
  bool result;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> local_138;
  PromiseResolver<QString> resolver_2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> local_128;
  QPromise<QString> p_2;
  QPromiseBase<QString> local_110;
  QPromise<int> p_3;
  PromiseResolver<std::vector<int,_std::allocator<int>_>_> resolver_3;
  undefined1 local_e0 [24];
  PromiseData<QString> *local_c8;
  PromiseResolver<QString> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> local_a8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> local_a0;
  QPromise<QString> p_1;
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type p_Stack_70;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_68;
  QPromise<int> p;
  
  QString::QString((QString *)local_e0,"42foo");
  local_68.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00148170;
  pPVar6 = (PromiseData<QString> *)operator_new(0x68);
  (pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar6->m_value).m_data.super___shared_ptr<QString,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.size = 0;
  (pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.size = 0;
  (pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_settled = 0;
  (pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData
       = 0;
  (pPVar6->m_value).m_data.super___shared_ptr<QString,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<QString>::PromiseData(pPVar6);
  LOCK();
  pQVar1 = &(pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar6 != (PromiseData<QString> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_88._M_unused._M_object = &PTR__QPromiseBase_001486c8;
  local_88._8_8_ = pPVar6;
  local_68.super__Function_base._M_functor._8_8_ = pPVar6;
  QtPromisePrivate::PromiseResolver<QString>::PromiseResolver
            (&resolver,(QPromise<QString> *)&local_88);
  QtPromise::QPromiseBase<QString>::~QPromiseBase((QPromiseBase<QString> *)&local_88);
  if (resolver.m_d.d == (Data *)0x0) {
    p_2.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    p_2.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)resolver;
  }
  p_3.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  if ((Data *)p_2.super_QPromiseBase<QString>._vptr_QPromiseBase == (Data *)0x0) {
    local_110._vptr_QPromiseBase = (_func_int **)0x0;
  }
  else {
    LOCK();
    (((Data *)p_2.super_QPromiseBase<QString>._vptr_QPromiseBase)->super_QSharedData).ref.
    super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i
         = (((Data *)p_2.super_QPromiseBase<QString>._vptr_QPromiseBase)->super_QSharedData).ref.
           super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_110._vptr_QPromiseBase = p_2.super_QPromiseBase<QString>._vptr_QPromiseBase;
  }
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::vector<int,_std::allocator<int>_>_>::Data>
        )(Data *)0x0;
  QtPromisePrivate::PromiseResolver<QString>::resolve<QString>
            ((PromiseResolver<QString> *)&p_2,(QString *)local_e0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> *)
             &local_110);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> *)
             &resolver_3);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> *)&p_2)
  ;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> *)&p_3)
  ;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  local_68.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_001486c8;
  QtPromise::QPromise<QString>::convert<int>((QPromise<QString> *)&p);
  QtPromise::QPromiseBase<QString>::~QPromiseBase((QPromiseBase<QString> *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_e0);
  bVar4 = waitForRejected<QtPromise::QPromiseConversionException,QtPromise::QPromise<int>>(&p);
  reject = (QPromiseReject<QString> *)0xf4;
  cVar5 = QTest::qVerify(bVar4,"waitForRejected<QtPromise::QPromiseConversionException>(p)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                         ,0xf4);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p.super_QPromiseBase<int>);
  if (cVar5 != '\0') {
    p.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)CONCAT44(p.super_QPromiseBase<int>._vptr_QPromiseBase._4_4_,0x2a);
    QVariant::QVariant((QVariant *)local_e0,(QMetaType)0x149468,&p);
    QtPromise::resolve<QVariant>((QtPromise *)&local_88,(QVariant *)local_e0);
    QtPromise::QPromise<QVariant>::convert<QString>((QPromise<QVariant> *)&p_1);
    QtPromise::QPromiseBase<QVariant>::~QPromiseBase((QPromiseBase<QVariant> *)&local_88);
    QVariant::~QVariant((QVariant *)local_e0);
    result = false;
    p_2.super_QPromiseBase<QString>.m_d = p_1.super_QPromiseBase<QString>.m_d;
    if (p_1.super_QPromiseBase<QString>.m_d.d != (PromiseData<QString> *)0x0) {
      LOCK();
      pQVar1 = &((p_1.super_QPromiseBase<QString>.m_d.d)->
                super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    p_2.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001486c8;
    p_3.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001481a0;
    pPVar6 = (PromiseData<QString> *)operator_new(0x58);
    (((PromiseDataBase<void,_void_()> *)
     &pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_catchers).d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (((PromiseDataBase<void,_void_()> *)
     &pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_catchers).d.size = 0;
    (((PromiseDataBase<void,_void_()> *)
     &pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_handlers).d.size = 0;
    (((PromiseDataBase<void,_void_()> *)
     &pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_catchers).d.d = (Data *)0x0
    ;
    (((PromiseDataBase<void,_void_()> *)
     &pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_handlers).d.d = (Data *)0x0
    ;
    (((PromiseDataBase<void,_void_()> *)
     &pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_handlers).d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
    *(undefined8 *)
     &((PromiseDataBase<void,_void_()> *)
      &pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_lock = 0;
    *(undefined8 *)
     &((PromiseDataBase<void,_void_()> *)
      &pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_settled = 0;
    ((PromiseDataBase<void,_void_()> *)
    &pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->_vptr_PromiseDataBase =
         (_func_int **)0x0;
    *(undefined8 *)
     &((PromiseDataBase<void,_void_()> *)
      &pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->super_QSharedData = 0;
    (((PromiseDataBase<void,_void_()> *)
     &pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_error).m_data.
    _M_exception_object = (void *)0x0;
    QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)pPVar6);
    LOCK();
    pQVar1 = &((PromiseDataBase<void,_void_()> *)
              &pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (pPVar6 != (PromiseData<QString> *)0x0) {
      LOCK();
      pQVar1 = &((PromiseDataBase<void,_void_()> *)
                &pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_88._M_unused._M_object = &PTR__QPromiseBase_001484d8;
    p_3.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)pPVar6;
    local_88._8_8_ = pPVar6;
    QtPromisePrivate::PromiseResolver<void>::PromiseResolver
              ((PromiseResolver<void> *)&resolver,(QPromise<void> *)&local_88);
    QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_88);
    QVar2 = p_2.super_QPromiseBase<QString>.m_d;
    if (resolver.m_d.d == (Data *)0x0) {
      resolver.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>)
           (Data *)0x0;
    }
    else {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
    }
    resolver_2.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>)(Data *)0x0
    ;
    if (resolver.m_d.d == (Data *)0x0) {
      local_138.d = (Data *)0x0;
    }
    else {
      LOCK();
      (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_138 = resolver.m_d.d;
    }
    local_128.d = (Data *)0x0;
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (local_138.d != (Data *)0x0) {
      LOCK();
      ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
    p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
    local_110._vptr_QPromiseBase = (_func_int **)resolver.m_d.d;
    local_e0._0_8_ = resolver.m_d.d;
    local_e0._8_8_ = local_138.d;
    p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)operator_new(0x18);
    *p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int *)local_e0._0_8_;
    if ((Data *)local_e0._0_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_e0._0_8_ = *(int *)local_e0._0_8_ + 1;
      UNLOCK();
    }
    p.super_QPromiseBase<int>._vptr_QPromiseBase[1] = (_func_int *)local_e0._8_8_;
    if ((Data *)local_e0._8_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_e0._8_8_ = *(int *)local_e0._8_8_ + 1;
      UNLOCK();
    }
    QtPromisePrivate::
    PromiseHandler<QString,QtPromise::QPromiseBase<QString>::tapFail<waitForRejected<QtPromise::QPromiseConversionException,QtPromise::QPromise<QString>>(QtPromise::QPromise<QString>const&)::{lambda(QString_const&)#1}(QtPromise::QPromiseConversionException_const&)#1}>(waitForRejected<QtPromise::QPromiseConversionException,QtPromise::QPromise<QString>>(QtPromise::QPromise<QString>const&)::{lambda(QString_const&)#1}(QtPromise::QPromiseConversionException_const&)#1})const::{lambda(QString_const&)#1}()#1},void>
    ::
    create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(QtPromise::QPromiseBase<QString>::tapFail<waitForRejected<QtPromise::QPromiseConversionException,QtPromise::QPromise<QString>>(QtPromise::QPromise<QString>const&)::{lambda(QString_const&)#1}(QtPromise::QPromiseConversionException_const&)#1}>(waitForRejected<QtPromise::QPromiseConversionException,QtPromise::QPromise<QString>>(QtPromise::QPromise<QString>const&)::{lambda(QString_const&)#1}(QtPromise::QPromiseConversionException_const&)#1})const::{lambda(QString_const&)#1}()#1}const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
    ::{lambda(QString_const&)#1}::~function((_lambda_QString_const___1_ *)local_e0);
    QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::addHandler
              (&(QVar2.d)->super_PromiseDataBase<QString,_void_(const_QString_&)>,
               (function<void_(const_QString_&)> *)&p);
    std::_Function_base::~_Function_base((_Function_base *)&p);
    QVar2 = p_2.super_QPromiseBase<QString>.m_d;
    local_e0._0_8_ = local_110._vptr_QPromiseBase;
    if ((Data *)local_110._vptr_QPromiseBase != (Data *)0x0) {
      LOCK();
      (((QSharedData *)local_110._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((QSharedData *)local_110._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_e0._8_8_ = local_138.d;
    if (local_138.d != (Data *)0x0) {
      LOCK();
      ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_e0._16_8_ = &result;
    local_68.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_68.super__Function_base._M_functor._8_8_ = 0;
    local_68.super__Function_base._M_manager = (_Manager_type)0x0;
    local_68._M_invoker = (_Invoker_type)0x0;
    local_68.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
    *(undefined8 *)local_68.super__Function_base._M_functor._M_unused._0_8_ = local_e0._0_8_;
    if ((Data *)local_e0._0_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_e0._0_8_ = *(int *)local_e0._0_8_ + 1;
      UNLOCK();
    }
    *(undefined8 *)((long)local_68.super__Function_base._M_functor._M_unused._0_8_ + 8) =
         local_e0._8_8_;
    if ((Data *)local_e0._8_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_e0._8_8_ = *(int *)local_e0._8_8_ + 1;
      UNLOCK();
    }
    *(undefined8 *)((long)local_68.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
         local_e0._16_8_;
    local_68._M_invoker =
         std::
         _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
         ::_M_invoke;
    local_68.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
         ::_M_manager;
    QtPromisePrivate::
    PromiseCatcher<QString,waitForRejected<QtPromise::QPromiseConversionException,QtPromise::QPromise<QString>>(QtPromise::QPromise<QString>const&)::{lambda(QtPromisePrivate::PromiseError_const&)#1}(QtPromise::QPromiseConversionException_const&)#1},QtPromise::QPromiseConversionException_const&>
    ::
    create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(waitForRejected<QtPromise::QPromiseConversionException,QtPromise::QPromise<QString>>(QtPromise::QPromise<QString>const&)::{lambda(QtPromisePrivate::PromiseError_const&)#1}(QtPromise::QPromiseConversionException_const&)#1}const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
    ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
              ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)local_e0);
    QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::addCatcher
              (&(QVar2.d)->super_PromiseDataBase<QString,_void_(const_QString_&)>,&local_68);
    std::_Function_base::~_Function_base(&local_68.super__Function_base);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
               &local_138);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
               &local_128);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
               &local_110);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
               &resolver_2);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
               &resolver);
    p_3.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001484d8;
    bVar4 = QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::isPending
                      (&(p_2.super_QPromiseBase<QString>.m_d.d)->
                        super_PromiseDataBase<QString,_void_(const_QString_&)>);
    if (!bVar4) {
      QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::dispatch
                (&(p_2.super_QPromiseBase<QString>.m_d.d)->
                  super_PromiseDataBase<QString,_void_(const_QString_&)>);
    }
    local_110.m_d.d = p_2.super_QPromiseBase<QString>.m_d.d;
    if (p_2.super_QPromiseBase<QString>.m_d.d != (PromiseData<QString> *)0x0) {
      LOCK();
      pQVar1 = &((p_2.super_QPromiseBase<QString>.m_d.d)->
                super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_110._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001486c8;
    resolver_3.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::vector<int,_std::allocator<int>_>_>::Data>
          )&PTR__QPromiseBase_00148170;
    pPVar6 = (PromiseData<QString> *)operator_new(0x68);
    (pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_error.m_data.
    _M_exception_object = (void *)0x0;
    (pPVar6->m_value).m_data.super___shared_ptr<QString,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.size = 0;
    (pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.size = 0;
    (pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.d = (Data *)0x0;
    (pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.d = (Data *)0x0;
    (pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
    *(undefined8 *)&(pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_lock = 0;
    *(undefined8 *)&(pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_settled = 0;
    (pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)._vptr_PromiseDataBase =
         (_func_int **)0x0;
    *(undefined8 *)
     &(pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData = 0;
    (pPVar6->m_value).m_data.super___shared_ptr<QString,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    QtPromisePrivate::PromiseData<QString>::PromiseData(pPVar6);
    LOCK();
    pQVar1 = &(pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (pPVar6 != (PromiseData<QString> *)0x0) {
      LOCK();
      pQVar1 = &(pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>)
         &PTR__QPromiseBase_001486c8;
    QtPromisePrivate::PromiseResolver<QString>::PromiseResolver
              (&resolver_2,(QPromise<QString> *)&resolver);
    QtPromise::QPromiseBase<QString>::~QPromiseBase((QPromiseBase<QString> *)&resolver);
    QVar3 = p_3.super_QPromiseBase<int>.m_d;
    if (resolver_2.m_d.d == (Data *)0x0) {
      local_138.d = (Data *)0x0;
    }
    else {
      LOCK();
      *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
      UNLOCK();
      local_138 = resolver_2.m_d.d;
    }
    local_128.d = (Data *)0x0;
    if (local_138.d == (Data *)0x0) {
      local_e0._8_8_ = (Data *)0x0;
    }
    else {
      LOCK();
      ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_e0._8_8_ = local_138.d;
    }
    local_a8.d = (Data *)0x0;
    if (local_138.d != (Data *)0x0) {
      LOCK();
      ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((Data *)local_e0._8_8_ != (Data *)0x0) {
      LOCK();
      (((Data *)local_e0._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_e0._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_c8 = local_110.m_d.d;
    if (local_110.m_d.d != (PromiseData<QString> *)0x0) {
      LOCK();
      pQVar1 = &((local_110.m_d.d)->super_PromiseDataBase<QString,_void_(const_QString_&)>).
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_e0._16_8_ = &PTR__QPromiseBase_001486c8;
    local_88._M_unused._M_object = (_func_int **)0x0;
    local_88._8_8_ = (PromiseData<QString> *)0x0;
    local_78 = (_Manager_type)0x0;
    p_Stack_70 = (_Invoker_type)0x0;
    local_e0._0_8_ = local_138.d;
    local_a0.d = (Data *)local_e0._8_8_;
    local_88._M_unused._M_object = operator_new(0x20);
    *(undefined8 *)local_88._M_unused._0_8_ = local_e0._0_8_;
    if ((Data *)local_e0._0_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_e0._0_8_ = *(int *)local_e0._0_8_ + 1;
      UNLOCK();
    }
    *(undefined8 *)((long)local_88._M_unused._0_8_ + 8) = local_e0._8_8_;
    if ((Data *)local_e0._8_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_e0._8_8_ = *(int *)local_e0._8_8_ + 1;
      UNLOCK();
    }
    *(undefined ***)((long)local_88._M_unused._0_8_ + 0x10) = &PTR__QPromiseBase_00148170;
    *(PromiseData<QString> **)((long)local_88._M_unused._0_8_ + 0x18) = local_c8;
    if (local_c8 != (PromiseData<QString> *)0x0) {
      LOCK();
      pQVar1 = &(local_c8->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData
      ;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    *(undefined ***)((long)local_88._M_unused._0_8_ + 0x10) = &PTR__QPromiseBase_001486c8;
    p_Stack_70 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
               ::_M_manager;
    QtPromisePrivate::
    PromiseHandler<void,QtPromise::QPromiseBase<QString>::tapFail<waitForRejected<QtPromise::QPromiseConversionException,QtPromise::QPromise<QString>>(QtPromise::QPromise<QString>const&)::{lambda()#1}(QtPromise::QPromiseConversionException_const&)#1}>(waitForRejected<QtPromise::QPromiseConversionException,QtPromise::QPromise<QString>>(QtPromise::QPromise<QString>const&)::{lambda()#1}(QtPromise::QPromiseConversionException_const&)#1})const::{lambda()#1}()#2},void>
    ::
    create<QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>>(QtPromise::QPromiseBase<QString>::tapFail<waitForRejected<QtPromise::QPromiseConversionException,QtPromise::QPromise<QString>>(QtPromise::QPromise<QString>const&)::{lambda()#1}(QtPromise::QPromiseConversionException_const&)#1}>(waitForRejected<QtPromise::QPromiseConversionException,QtPromise::QPromise<QString>>(QtPromise::QPromise<QString>const&)::{lambda()#1}(QtPromise::QPromiseConversionException_const&)#1})const::{lambda()#1}()#2}const&,QtPromise::QPromiseResolve<QString>const&,QtPromise::QPromiseReject<QString>const&)
    ::{lambda()#1}::~function((_lambda___1_ *)local_e0);
    QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
              ((PromiseDataBase<void,_void_()> *)QVar3.d,(function<void_()> *)&local_88);
    std::_Function_base::~_Function_base((_Function_base *)&local_88);
    QVar3 = p_3.super_QPromiseBase<int>.m_d;
    QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
    create<QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>>
              ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)local_e0,
               (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_138,
               (QPromiseResolve<QString> *)&local_a0,reject);
    QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
              ((PromiseDataBase<void,_void_()> *)QVar3.d,
               (function<void_(const_QtPromisePrivate::PromiseError_&)> *)local_e0);
    std::_Function_base::~_Function_base((_Function_base *)local_e0);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer(&local_a0);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer(&local_a8);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer(&local_138);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer(&local_128);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer(&resolver_2.m_d);
    resolver_3.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::vector<int,_std::allocator<int>_>_>::Data>
          )&PTR__QPromiseBase_001486c8;
    bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                      ((PromiseDataBase<void,_void_()> *)p_3.super_QPromiseBase<int>.m_d.d);
    if (!bVar4) {
      QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
                ((PromiseDataBase<void,_void_()> *)p_3.super_QPromiseBase<int>.m_d.d);
    }
    QtPromise::QPromiseBase<QString>::~QPromiseBase(&local_110);
    QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&p_3);
    QtPromise::QPromiseBase<QString>::~QPromiseBase(&p_2.super_QPromiseBase<QString>);
    QtPromise::QPromiseBase<QString>::wait((QPromiseBase<QString> *)&resolver,&resolver_3);
    QtPromise::QPromiseBase<QString>::~QPromiseBase((QPromiseBase<QString> *)&resolver);
    QtPromise::QPromiseBase<QString>::~QPromiseBase((QPromiseBase<QString> *)&resolver_3);
    cVar5 = QTest::qVerify(result,"waitForRejected<QtPromise::QPromiseConversionException>(p)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                           ,0xfd);
    QtPromise::QPromiseBase<QString>::~QPromiseBase(&p_1.super_QPromiseBase<QString>);
    if (cVar5 != '\0') {
      local_a0.d = (Data *)0xffffffd60000002a;
      __l._M_len = 2;
      __l._M_array = (iterator)&local_a0;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&resolver,__l,(allocator_type *)&local_a8);
      local_110._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00148200;
      pPVar6 = (PromiseData<QString> *)operator_new(0x68);
      (((PromiseDataBase<std::vector<int,_std::allocator<int>_>,_void_(const_std::vector<int,_std::allocator<int>_>_&)>
         *)&pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_error).m_data.
      _M_exception_object = (void *)0x0;
      (pPVar6->m_value).m_data.super___shared_ptr<QString,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (((PromiseDataBase<std::vector<int,_std::allocator<int>_>,_void_(const_std::vector<int,_std::allocator<int>_>_&)>
         *)&pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_catchers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (((PromiseDataBase<std::vector<int,_std::allocator<int>_>,_void_(const_std::vector<int,_std::allocator<int>_>_&)>
         *)&pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_catchers).d.size = 0;
      (((PromiseDataBase<std::vector<int,_std::allocator<int>_>,_void_(const_std::vector<int,_std::allocator<int>_>_&)>
         *)&pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_handlers).d.size = 0;
      (((PromiseDataBase<std::vector<int,_std::allocator<int>_>,_void_(const_std::vector<int,_std::allocator<int>_>_&)>
         *)&pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_catchers).d.d =
           (Data *)0x0;
      (((PromiseDataBase<std::vector<int,_std::allocator<int>_>,_void_(const_std::vector<int,_std::allocator<int>_>_&)>
         *)&pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_handlers).d.d =
           (Data *)0x0;
      (((PromiseDataBase<std::vector<int,_std::allocator<int>_>,_void_(const_std::vector<int,_std::allocator<int>_>_&)>
         *)&pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_handlers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
      *(undefined8 *)
       &((PromiseDataBase<std::vector<int,_std::allocator<int>_>,_void_(const_std::vector<int,_std::allocator<int>_>_&)>
          *)&pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_lock = 0;
      *(undefined8 *)
       &((PromiseDataBase<std::vector<int,_std::allocator<int>_>,_void_(const_std::vector<int,_std::allocator<int>_>_&)>
          *)&pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_settled = 0;
      ((PromiseDataBase<std::vector<int,_std::allocator<int>_>,_void_(const_std::vector<int,_std::allocator<int>_>_&)>
        *)&pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->_vptr_PromiseDataBase =
           (_func_int **)0x0;
      *(undefined8 *)
       &((PromiseDataBase<std::vector<int,_std::allocator<int>_>,_void_(const_std::vector<int,_std::allocator<int>_>_&)>
          *)&pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->super_QSharedData = 0;
      (pPVar6->m_value).m_data.super___shared_ptr<QString,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      QtPromisePrivate::PromiseData<std::vector<int,_std::allocator<int>_>_>::PromiseData
                ((PromiseData<std::vector<int,_std::allocator<int>_>_> *)pPVar6);
      LOCK();
      pQVar1 = &((PromiseDataBase<std::vector<int,_std::allocator<int>_>,_void_(const_std::vector<int,_std::allocator<int>_>_&)>
                  *)&pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      if (pPVar6 != (PromiseData<QString> *)0x0) {
        LOCK();
        pQVar1 = &((PromiseDataBase<std::vector<int,_std::allocator<int>_>,_void_(const_std::vector<int,_std::allocator<int>_>_&)>
                    *)&pPVar6->super_PromiseDataBase<QString,_void_(const_QString_&)>)->
                  super_QSharedData;
        (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      p_2.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00148b38
      ;
      p_2.super_QPromiseBase<QString>.m_d.d = pPVar6;
      local_110.m_d.d = pPVar6;
      QtPromisePrivate::PromiseResolver<std::vector<int,_std::allocator<int>_>_>::PromiseResolver
                (&resolver_3,(QPromise<std::vector<int,_std::allocator<int>_>_> *)&p_2);
      QtPromise::QPromiseBase<std::vector<int,_std::allocator<int>_>_>::~QPromiseBase
                ((QPromiseBase<std::vector<int,_std::allocator<int>_>_> *)&p_2);
      if (resolver_3.m_d.d == (Data *)0x0) {
        p_1.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)0x0;
      }
      else {
        LOCK();
        *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
        UNLOCK();
        p_1.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)resolver_3;
      }
      resolver_2.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>)
           (Data *)0x0;
      if ((Data *)p_1.super_QPromiseBase<QString>._vptr_QPromiseBase == (Data *)0x0) {
        local_138.d = (Data *)0x0;
      }
      else {
        LOCK();
        (((Data *)p_1.super_QPromiseBase<QString>._vptr_QPromiseBase)->super_QSharedData).ref.
        super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
        _M_i = (((Data *)p_1.super_QPromiseBase<QString>._vptr_QPromiseBase)->super_QSharedData).ref
               .super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + 1;
        UNLOCK();
        local_138.d = (Data *)p_1.super_QPromiseBase<QString>._vptr_QPromiseBase;
      }
      local_128.d = (Data *)0x0;
      QtPromisePrivate::PromiseResolver<std::vector<int,std::allocator<int>>>::
      resolve<std::vector<int,std::allocator<int>>>
                ((PromiseResolver<std::vector<int,std::allocator<int>>> *)&p_1,
                 (vector<int,_std::allocator<int>_> *)&resolver);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::vector<int,_std::allocator<int>_>_>::Data>
      ::~QExplicitlySharedDataPointer
                ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::vector<int,_std::allocator<int>_>_>::Data>
                  *)&local_138);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::vector<int,_std::allocator<int>_>_>::Data>
      ::~QExplicitlySharedDataPointer
                ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::vector<int,_std::allocator<int>_>_>::Data>
                  *)&local_128);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::vector<int,_std::allocator<int>_>_>::Data>
      ::~QExplicitlySharedDataPointer
                ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::vector<int,_std::allocator<int>_>_>::Data>
                  *)&p_1);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::vector<int,_std::allocator<int>_>_>::Data>
      ::~QExplicitlySharedDataPointer
                ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::vector<int,_std::allocator<int>_>_>::Data>
                  *)&resolver_2);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::vector<int,_std::allocator<int>_>_>::Data>
      ::~QExplicitlySharedDataPointer(&resolver_3.m_d);
      local_110._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00148b38;
      QtPromise::QPromise<std::vector<int,_std::allocator<int>_>_>::convert<int>
                ((QPromise<std::vector<int,_std::allocator<int>_>_> *)&p_3);
      QtPromise::QPromiseBase<std::vector<int,_std::allocator<int>_>_>::~QPromiseBase
                ((QPromiseBase<std::vector<int,_std::allocator<int>_>_> *)&local_110);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&resolver);
      bVar4 = waitForRejected<QtPromise::QPromiseConversionException,QtPromise::QPromise<int>>(&p_3)
      ;
      QTest::qVerify(bVar4,"waitForRejected<QtPromise::QPromiseConversionException>(p)","",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                     ,0x106);
      QtPromise::QPromiseBase<int>::~QPromiseBase(&p_3.super_QPromiseBase<int>);
    }
  }
  return;
}

Assistant:

void tst_qpromise_convert::rejectUnconvertibleTypes()
{
    // A string incompatible with int due to its value.
    {
        auto p = QtPromise::resolve(QString{"42foo"}).convert<int>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));

        QVERIFY(waitForRejected<QtPromise::QPromiseConversionException>(p));
    }

    // A user-defined type unconvertible to string because there is no converter.
    {
        auto p = QtPromise::resolve(QVariant::fromValue(Bar{42})).convert<QString>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QString>>::value));

        QVERIFY(waitForRejected<QtPromise::QPromiseConversionException>(p));
    }

    // A standard library type unconvertible to a primitive type because there is no converter.
    {
        auto p = QtPromise::resolve(std::vector<int>{42, -42}).convert<int>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));

        QVERIFY(waitForRejected<QtPromise::QPromiseConversionException>(p));
    }
}